

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_UsePuzzleItem(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  AActor *ent;
  bool bVar1;
  uint uVar2;
  FSoundID local_3c;
  AInventory *local_38;
  AInventory *item;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (it != (AActor *)0x0) {
    item._0_4_ = arg2;
    item._4_4_ = arg1;
    arg2_local = arg0;
    arg1_local._3_1_ = backSide;
    _arg0_local = it;
    it_local = (AActor *)ln;
    for (local_38 = TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&it->Inventory);
        local_38 != (AInventory *)0x0;
        local_38 = TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)&(local_38->super_AActor).Inventory)) {
      bVar1 = DObject::IsKindOf((DObject *)local_38,APuzzleItem::RegistrationInfo.MyClass);
      if ((bVar1) && (*(int *)&local_38->field_0x4fc == arg2_local)) {
        uVar2 = (*(_arg0_local->super_DThinker).super_DObject._vptr_DObject[0x17])
                          (_arg0_local,local_38);
        if ((uVar2 & 1) != 0) {
          return 1;
        }
        break;
      }
    }
    ent = _arg0_local;
    FSoundID::FSoundID(&local_3c,"*puzzfail");
    S_Sound(ent,2,&local_3c,1.0,1.001);
  }
  return 0;
}

Assistant:

FUNC(LS_UsePuzzleItem)
// UsePuzzleItem (item, script)
{
	AInventory *item;

	if (!it) return false;

	// Check player's inventory for puzzle item
	for (item = it->Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf (RUNTIME_CLASS(APuzzleItem)))
		{
			if (static_cast<APuzzleItem*>(item)->PuzzleItemNumber == arg0)
			{
				if (it->UseInventory (item))
				{
					return true;
				}
				break;
			}
		}
	}

	// [RH] Say "hmm" if you don't have the puzzle item
	S_Sound (it, CHAN_VOICE, "*puzzfail", 1, ATTN_IDLE);
	return false;
}